

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O0

U32 duckdb_lz4::LZ4_hash5(U64 sequence,tableType_t tableType)

{
  char cVar1;
  uint uVar2;
  int in_ESI;
  ulong in_RDI;
  U64 prime8bytes;
  U64 prime5bytes;
  U32 hashLog;
  undefined4 local_4;
  
  cVar1 = '\f';
  if (in_ESI == 3) {
    cVar1 = '\r';
  }
  uVar2 = LZ4_isLittleEndian();
  if (uVar2 == 0) {
    local_4 = (U32)((in_RDI >> 0x18) * -0x61c8864e7a143579 >> (0x40U - cVar1 & 0x3f));
  }
  else {
    local_4 = (U32)(in_RDI * -0x30e4432345000000 >> (0x40U - cVar1 & 0x3f));
  }
  return local_4;
}

Assistant:

LZ4_FORCE_INLINE U32 LZ4_hash5(U64 sequence, tableType_t const tableType)
{
    const U32 hashLog = (tableType == byU16) ? LZ4_HASHLOG+1 : LZ4_HASHLOG;
    if (LZ4_isLittleEndian()) {
        const U64 prime5bytes = 889523592379ULL;
        return (U32)(((sequence << 24) * prime5bytes) >> (64 - hashLog));
    } else {
        const U64 prime8bytes = 11400714785074694791ULL;
        return (U32)(((sequence >> 24) * prime8bytes) >> (64 - hashLog));
    }
}